

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-backend-egl.c
# Opt level: O0

wpe_renderer_backend_egl * wpe_renderer_backend_egl_create(int host_fd)

{
  wpe_renderer_backend_egl_interface *pwVar1;
  void *pvVar2;
  wpe_renderer_backend_egl *backend;
  wpe_renderer_backend_egl *pwStack_10;
  int host_fd_local;
  
  pwStack_10 = (wpe_renderer_backend_egl *)
               wpe_calloc_impl(1,0x10,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/renderer-backend-egl.c"
                               ,0x24);
  pwVar1 = (wpe_renderer_backend_egl_interface *)
           wpe_load_object("_wpe_renderer_backend_egl_interface");
  (pwStack_10->base).interface = pwVar1;
  if ((pwStack_10->base).interface == (wpe_renderer_backend_egl_interface *)0x0) {
    free(pwStack_10);
    pwStack_10 = (wpe_renderer_backend_egl *)0x0;
  }
  else {
    pvVar2 = (*((pwStack_10->base).interface)->create)(host_fd);
    (pwStack_10->base).interface_data = pvVar2;
  }
  return pwStack_10;
}

Assistant:

struct wpe_renderer_backend_egl*
wpe_renderer_backend_egl_create(int host_fd)
{
    struct wpe_renderer_backend_egl* backend = wpe_calloc(1, sizeof(struct wpe_renderer_backend_egl));

    backend->base.interface = wpe_load_object("_wpe_renderer_backend_egl_interface");
    if (!backend->base.interface) {
        wpe_free(backend);
        return 0;
    }

    backend->base.interface_data = backend->base.interface->create(host_fd);

    return backend;
}